

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void gen_negv_mask(TCGContext_conflict9 *tcg_ctx,TCGv_i64 d,TCGv_i64 b,TCGv_i64 m)

{
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 t3;
  TCGv_i64 t2;
  TCGv_i64 m_local;
  TCGv_i64 b_local;
  TCGv_i64 d_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  ret = tcg_temp_new_i64(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_andc_i64_tricore(tcg_ctx,ret_00,m,b);
  tcg_gen_andc_i64_tricore(tcg_ctx,ret,b,m);
  tcg_gen_sub_i64(tcg_ctx,d,m,ret);
  tcg_gen_xor_i64_tricore(tcg_ctx,d,d,ret_00);
  tcg_temp_free_i64(tcg_ctx,ret);
  tcg_temp_free_i64(tcg_ctx,ret_00);
  return;
}

Assistant:

static void gen_negv_mask(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 b, TCGv_i64 m)
{
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_andc_i64(tcg_ctx, t3, m, b);
    tcg_gen_andc_i64(tcg_ctx, t2, b, m);
    tcg_gen_sub_i64(tcg_ctx, d, m, t2);
    tcg_gen_xor_i64(tcg_ctx, d, d, t3);

    tcg_temp_free_i64(tcg_ctx, t2);
    tcg_temp_free_i64(tcg_ctx, t3);
}